

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegexpIsDeterminist(xmlRegexpPtr comp)

{
  int iVar1;
  xmlAutomataPtr ctxt;
  xmlRegStatePtr *ppxVar2;
  long lVar3;
  
  iVar1 = -1;
  if ((comp != (xmlRegexpPtr)0x0) && (iVar1 = comp->determinist, iVar1 == -1)) {
    ctxt = xmlNewAutomata();
    iVar1 = -1;
    if (ctxt != (xmlAutomataPtr)0x0) {
      ppxVar2 = ctxt->states;
      if (ppxVar2 != (xmlRegStatePtr *)0x0) {
        if (0 < ctxt->nbStates) {
          lVar3 = 0;
          do {
            xmlRegFreeState(ctxt->states[lVar3]);
            lVar3 = lVar3 + 1;
          } while (lVar3 < ctxt->nbStates);
          ppxVar2 = ctxt->states;
        }
        (*xmlFree)(ppxVar2);
      }
      ctxt->nbAtoms = comp->nbAtoms;
      ctxt->atoms = comp->atoms;
      ctxt->nbStates = comp->nbStates;
      ctxt->states = comp->states;
      ctxt->determinist = -1;
      ctxt->flags = comp->flags;
      iVar1 = xmlFAComputesDeterminism(ctxt);
      ctxt->atoms = (xmlRegAtomPtr *)0x0;
      ctxt->states = (xmlRegStatePtr *)0x0;
      xmlRegFreeParserCtxt(ctxt);
      comp->determinist = iVar1;
    }
  }
  return iVar1;
}

Assistant:

int
xmlRegexpIsDeterminist(xmlRegexpPtr comp) {
    xmlAutomataPtr am;
    int ret;

    if (comp == NULL)
	return(-1);
    if (comp->determinist != -1)
	return(comp->determinist);

    am = xmlNewAutomata();
    if (am == NULL)
        return(-1);
    if (am->states != NULL) {
	int i;

	for (i = 0;i < am->nbStates;i++)
	    xmlRegFreeState(am->states[i]);
	xmlFree(am->states);
    }
    am->nbAtoms = comp->nbAtoms;
    am->atoms = comp->atoms;
    am->nbStates = comp->nbStates;
    am->states = comp->states;
    am->determinist = -1;
    am->flags = comp->flags;
    ret = xmlFAComputesDeterminism(am);
    am->atoms = NULL;
    am->states = NULL;
    xmlFreeAutomata(am);
    comp->determinist = ret;
    return(ret);
}